

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O2

void __thiscall BufferInputSource::~BufferInputSource(BufferInputSource *this)

{
  Buffer *this_00;
  
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__BufferInputSource_002abb40;
  if (this->own_memory == true) {
    this_00 = this->buf;
    if (this_00 != (Buffer *)0x0) {
      Buffer::~Buffer(this_00);
    }
    operator_delete(this_00,8);
  }
  std::__cxx11::string::~string((string *)&this->description);
  return;
}

Assistant:

BufferInputSource::~BufferInputSource()
{
    if (this->own_memory) {
        delete this->buf;
    }
}